

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::Swap
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void **ppvVar4;
  int swap_total_size;
  int swap_allocated_size;
  int swap_current_size;
  void **swap_elements;
  RepeatedPtrFieldBase *other_local;
  RepeatedPtrFieldBase *this_local;
  
  if (this != other) {
    ppvVar4 = this->elements_;
    iVar1 = this->current_size_;
    iVar2 = this->allocated_size_;
    iVar3 = this->total_size_;
    this->elements_ = other->elements_;
    this->current_size_ = other->current_size_;
    this->allocated_size_ = other->allocated_size_;
    this->total_size_ = other->total_size_;
    other->elements_ = ppvVar4;
    other->current_size_ = iVar1;
    other->allocated_size_ = iVar2;
    other->total_size_ = iVar3;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Swap(RepeatedPtrFieldBase* other) {
  if (this == other) return;
  void** swap_elements       = elements_;
  int    swap_current_size   = current_size_;
  int    swap_allocated_size = allocated_size_;
  int    swap_total_size     = total_size_;

  elements_       = other->elements_;
  current_size_   = other->current_size_;
  allocated_size_ = other->allocated_size_;
  total_size_     = other->total_size_;

  other->elements_       = swap_elements;
  other->current_size_   = swap_current_size;
  other->allocated_size_ = swap_allocated_size;
  other->total_size_     = swap_total_size;
}